

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_GetBoolArg::test_method(util_GetBoolArg *this)

{
  byte bVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  iterator pvVar5;
  iterator pvVar6;
  long lVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  check_type cVar8;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  allocator<char> local_531;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  assertion_result local_4c0;
  char **local_4a8;
  assertion_result local_4a0;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  pair<const_char_*,_ArgsManager::Flags> local_428;
  pair<const_char_*,_ArgsManager::Flags> local_418;
  pair<const_char_*,_ArgsManager::Flags> local_408;
  pair<const_char_*,_ArgsManager::Flags> local_3f8;
  pair<const_char_*,_ArgsManager::Flags> local_3e8;
  pair<const_char_*,_ArgsManager::Flags> local_3d8;
  undefined1 local_3c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_378;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_350;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_328;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_300;
  string error;
  char *argv_test [7];
  TestArgsManager testArgs;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager(&testArgs);
  local_3d8.first = "-a";
  local_428.second = ALLOW_ANY;
  local_3e8.first = "-b";
  local_3f8.first = "-c";
  local_408.first = "-d";
  local_418.first = "-e";
  local_428.first = "-f";
  argv_test[6] = "-f=true";
  argv_test[4] = "-d=1";
  argv_test[5] = "-e=false";
  argv_test[2] = "-nob";
  argv_test[3] = "-c=0";
  argv_test[0] = "ignored";
  argv_test[1] = "-a";
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  pvVar5 = (iterator)0x14e;
  pvVar6 = (iterator)0x0;
  local_418.second = local_428.second;
  local_408.second = local_428.second;
  local_3f8.second = local_428.second;
  local_3e8.second = local_428.second;
  local_3d8.second = local_428.second;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,(AnnotatedMixin<std::recursive_mutex> *)&testArgs,"testArgs.cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
             ,0x14e,false);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_3c8,&local_3d8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_3a0,&local_3e8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_378,&local_3f8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_350,&local_408);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_328,&local_418);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_300,&local_428);
  __l._M_len = 6;
  __l._M_array = (iterator)local_3c8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_4c0,__l,(allocator_type *)&local_4a0);
  TestArgsManager::SetupArgs
            (&testArgs,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&local_4c0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_4c0);
  lVar7 = 200;
  do {
    std::__cxx11::string::~string((string *)(local_3c8 + lVar7));
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x28);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar6;
  msg.m_begin = pvVar5;
  file.m_end = (iterator)0x150;
  file.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_458,msg);
  bVar4 = ArgsManager::ParseParameters(&testArgs.super_ArgsManager,7,argv_test,&error);
  local_4c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar4;
  local_4c0.m_message.px = (element_type *)0x0;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "testArgs.ParseParameters(7, argv_test, error)";
  local_4a0.m_message.px = (element_type *)0xb5274a;
  local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
  local_3c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_3b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_460 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_3b8._8_8_ = (allocator_type *)&local_4a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4c0,(lazy_ostream *)local_3c8,1,0,WARN,_cVar8,(size_t)&local_468,0x150);
  boost::detail::shared_count::~shared_count(&local_4c0.m_message.pn);
  for (lVar7 = 0; lVar7 != 7; lVar7 = lVar7 + 1) {
    bVar1 = "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"[lVar7 + 0x3a];
    local_478 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_470 = "";
    local_488 = &boost::unit_test::basic_cstring<char_const>::null;
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    file_00.m_end = (iterator)0x154;
    file_00.m_begin = (iterator)&local_478;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_488,
               msg_00);
    uVar3 = local_3b8._M_allocated_capacity;
    local_3c8._0_8_ = &local_3b8;
    local_3b8._M_allocated_capacity._0_2_ = (ushort)bVar1 << 8 | 0x2d;
    local_3c8._8_8_ = 2;
    local_3b8._M_allocated_capacity._3_5_ = SUB85(uVar3,3);
    local_3b8._M_local_buf[2] = 0;
    bVar4 = ArgsManager::IsArgSet(&testArgs.super_ArgsManager,(string *)local_3c8);
    local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(bVar4 || bVar1 == 0);
    local_4a0.m_message.px = (element_type *)0x0;
    local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_4d0 = "testArgs.IsArgSet({\'-\', opt}) || !opt";
    local_4c8 = "";
    local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
    local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
    local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_4a8 = &local_4d0;
    local_4e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_4d8 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_4e0,0x154);
    boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
    std::__cxx11::string::~string((string *)local_3c8);
  }
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x158;
  file_01.m_begin = (iterator)&local_4f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_500,
             msg_01);
  local_4c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (testArgs.super_ArgsManager.m_settings.command_line_options._M_t._M_impl.
        super__Rb_tree_header._M_node_count == 6 &&
       testArgs.super_ArgsManager.m_settings.ro_config._M_t._M_impl.super__Rb_tree_header.
       _M_node_count == 0);
  local_4c0.m_message.px = (element_type *)0x0;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ =
       "testArgs.m_settings.command_line_options.size() == 6 && testArgs.m_settings.ro_config.empty()"
  ;
  local_4a0.m_message.px = (element_type *)0xb52c85;
  local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
  local_3c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_3b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3b8._8_8_ = &local_4a0;
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_508 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4c0,(lazy_ostream *)local_3c8,1,0,WARN,_cVar8,(size_t)&local_510,0x158);
  boost::detail::shared_count::~shared_count(&local_4c0.m_message.pn);
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x15b;
  file_02.m_begin = (iterator)&local_520;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_530,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-nob",&local_531);
  bVar4 = ArgsManager::IsArgSet(&testArgs.super_ArgsManager,(string *)local_3c8);
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "!testArgs.IsArgSet(\"-nob\")";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_540 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_548,0x15b);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x15e;
  file_03.m_begin = (iterator)&local_558;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_568,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-b",&local_531);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ArgsManager::IsArgNegated(&testArgs.super_ArgsManager,(string *)local_3c8);
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "testArgs.IsArgNegated(\"-b\")";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_570 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_578,0x15e);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x15f;
  file_04.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_598,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-a",&local_531);
  bVar4 = ArgsManager::IsArgNegated(&testArgs.super_ArgsManager,(string *)local_3c8);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar4;
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "!testArgs.IsArgNegated(\"-a\")";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5a0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_5a8,0x15f);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x162;
  file_05.m_begin = (iterator)&local_5b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5c8,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-a",&local_531);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,(string *)local_3c8,false);
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "testArgs.GetBoolArg(\"-a\", false) == true";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5d0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_5d8,0x162);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x163;
  file_06.m_begin = (iterator)&local_5e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_5f8,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-b",&local_531);
  bVar4 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,(string *)local_3c8,true);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar4;
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "testArgs.GetBoolArg(\"-b\", true) == false";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_600 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_608,0x163);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0x164;
  file_07.m_begin = (iterator)&local_618;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_628,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-c",&local_531);
  bVar4 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,(string *)local_3c8,true);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar4;
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "testArgs.GetBoolArg(\"-c\", true) == false";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_630 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_638,0x164);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0x165;
  file_08.m_begin = (iterator)&local_648;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_658,
             msg_08);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-d",&local_531);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,(string *)local_3c8,false);
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "testArgs.GetBoolArg(\"-d\", false) == true";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_660 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_668,0x165);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  file_09.m_end = (iterator)0x166;
  file_09.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_688,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-e",&local_531);
  bVar4 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,(string *)local_3c8,true);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar4;
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "testArgs.GetBoolArg(\"-e\", true) == false";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_690 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_698,0x166);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  file_10.m_end = (iterator)0x167;
  file_10.m_begin = (iterator)&local_6a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_6b8,
             msg_10);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c8,"-f",&local_531);
  bVar4 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,(string *)local_3c8,true);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d0 = "testArgs.GetBoolArg(\"-f\", true) == false";
  local_4c8 = "";
  local_4c0.m_message.px = (element_type *)((ulong)local_4c0.m_message.px & 0xffffffffffffff00);
  local_4c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4d0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6c0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)&local_4c0,1,0,WARN,_cVar8,(size_t)&local_6c8,0x167);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  std::__cxx11::string::~string((string *)local_3c8);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  std::__cxx11::string::~string((string *)&error);
  ArgsManager::~ArgsManager(&testArgs.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetBoolArg)
{
    TestArgsManager testArgs;
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto c = std::make_pair("-c", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);
    const auto e = std::make_pair("-e", ArgsManager::ALLOW_ANY);
    const auto f = std::make_pair("-f", ArgsManager::ALLOW_ANY);

    const char *argv_test[] = {
        "ignored", "-a", "-nob", "-c=0", "-d=1", "-e=false", "-f=true"};
    std::string error;
    LOCK(testArgs.cs_args);
    testArgs.SetupArgs({a, b, c, d, e, f});
    BOOST_CHECK(testArgs.ParseParameters(7, argv_test, error));

    // Each letter should be set.
    for (const char opt : "abcdef")
        BOOST_CHECK(testArgs.IsArgSet({'-', opt}) || !opt);

    // Nothing else should be in the map
    BOOST_CHECK(testArgs.m_settings.command_line_options.size() == 6 &&
                testArgs.m_settings.ro_config.empty());

    // The -no prefix should get stripped on the way in.
    BOOST_CHECK(!testArgs.IsArgSet("-nob"));

    // The -b option is flagged as negated, and nothing else is
    BOOST_CHECK(testArgs.IsArgNegated("-b"));
    BOOST_CHECK(!testArgs.IsArgNegated("-a"));

    // Check expected values.
    BOOST_CHECK(testArgs.GetBoolArg("-a", false) == true);
    BOOST_CHECK(testArgs.GetBoolArg("-b", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-c", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-d", false) == true);
    BOOST_CHECK(testArgs.GetBoolArg("-e", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-f", true) == false);
}